

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unity.c
# Opt level: O1

void UnityPrintNumberByStyle(_U_SINT number,UNITY_DISPLAY_STYLE_T style)

{
  if ((style & 0x10) != 0) {
    if (number < 0) {
      putchar(0x2d);
      number = -number;
    }
    UnityPrintNumberUnsigned(number);
    return;
  }
  if ((style & 0x20) == 0) {
    UnityPrintNumberHex(number,(char)style * '\x02' & 0x1e);
    return;
  }
  UnityPrintNumberUnsigned
            (number & *(ulong *)("Unity 64-bit Support Disabled" + (ulong)(style & 0xf) * 8 + 0x18))
  ;
  return;
}

Assistant:

void UnityPrintNumberByStyle(const _U_SINT number, const UNITY_DISPLAY_STYLE_T style)
{
    if ((style & UNITY_DISPLAY_RANGE_INT) == UNITY_DISPLAY_RANGE_INT)
    {
        UnityPrintNumber(number);
    }
    else if ((style & UNITY_DISPLAY_RANGE_UINT) == UNITY_DISPLAY_RANGE_UINT)
    {
        UnityPrintNumberUnsigned(  (_U_UINT)number  &  UnitySizeMask[((_U_UINT)style & (_U_UINT)0x0F) - 1]  );
    }
    else
    {
        UnityPrintNumberHex((_U_UINT)number, (char)((style & 0x000F) << 1));
    }
}